

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitPropStore
          (ByteCodeGenerator *this,RegSlot rhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo,
          bool isLetDecl,bool isConstDecl,bool isFncDeclVar,bool skipUseBeforeDeclarationCheck)

{
  uint uVar1;
  Scope *symScope;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  OpCode OVar6;
  PropertyId PVar7;
  uint uVar8;
  RegSlot RVar9;
  ByteCodeLabel labelID;
  Scope **ppSVar10;
  undefined4 *puVar11;
  Scope *scope;
  Type *pTVar12;
  uint32 slotId1;
  ByteCodeGenerator *this_00;
  int i;
  int index;
  ByteCodeWriter *pBVar13;
  undefined1 local_b0 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  undefined1 local_6c [8];
  DynamicLoadRecord rec;
  PropertyId local_44;
  ByteCodeGenerator *pBStack_40;
  PropertyId envIndex;
  RegSlot local_38;
  bool local_31;
  
  local_44 = -1;
  if ((sym == (Symbol *)0x0) || ((sym->field_0x42 & 8) != 0)) {
    ppSVar10 = &this->globalScope;
  }
  else {
    ppSVar10 = &sym->scope;
  }
  symScope = *ppSVar10;
  recList._40_8_ = pid;
  pBStack_40 = (ByteCodeGenerator *)sym;
  local_38 = rhsLocation;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1224,"(symScope)","symScope");
    if (!bVar3) goto LAB_0080d703;
    *puVar11 = 0;
  }
  if ((pBStack_40 != (ByteCodeGenerator *)0x0) &&
     (((ulong)pBStack_40->parentScopeInfo & 0x40000000) != 0)) {
    if ((!isConstDecl) &&
       ((pBStack_40->funcInfoStack != (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0 &&
        (*(OpCode *)
          &(pBStack_40->funcInfoStack->
           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next == knopConstDecl)))) {
      Js::ByteCodeWriter::W1(&this->m_writer,RuntimeTypeError,0x41f);
    }
    EmitModuleExportAccess(this,(Symbol *)pBStack_40,StModuleSlot,local_38,funcInfo);
    return;
  }
  local_31 = isConstDecl;
  if (isFncDeclVar) {
    scope = (Scope *)0x0;
    do {
      scope = FindScopeForSym(this,symScope,scope,&local_44,funcInfo);
    } while (scope != symScope);
    rec.label = scope->location;
  }
  else {
    rec.label = -1;
    scope = (Scope *)0x0;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       this->alloc;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  local_b0 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  if (!isFncDeclVar) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pBVar13 = &this->m_writer;
    do {
      scope = FindScopeForSym(this,symScope,scope,&local_44,funcInfo);
      if (scope == this->globalScope) break;
      if (local_44 == -1) {
        if (scope->func != funcInfo) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x124f,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()"
                            );
          if (!bVar3) goto LAB_0080d703;
          *puVar11 = 0;
        }
        rec.label = scope->location;
      }
      if (scope == symScope) break;
      if ((scope == (Scope *)0x0) || ((scope->field_0x44 & 1) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1259,"(scope && scope->GetIsDynamic())",
                           "scope && scope->GetIsDynamic()");
        if (!bVar3) goto LAB_0080d703;
        *puVar11 = 0;
      }
      if ((scope->field_0x44 & 2) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x125a,"(scope->GetIsObject())","scope->GetIsObject()");
        if (!bVar3) goto LAB_0080d703;
        *puVar11 = 0;
      }
      DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)local_6c);
      local_6c._4_4_ = Js::ByteCodeWriter::DefineLabel(pBVar13);
      if (pBStack_40 == (ByteCodeGenerator *)0x0) {
        PVar7 = *(PropertyId *)(recList._40_8_ + 0x1c);
      }
      else {
        PVar7 = Symbol::EnsurePosition((Symbol *)pBStack_40,this);
      }
      uVar8 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar7);
      PVar7 = local_44;
      if (scope->scopeType == ScopeType_With) {
        if (local_44 == -1) {
          Js::ByteCodeWriter::BrProperty(pBVar13,BrOnHasProperty,local_6c._4_4_,rec.label,uVar8);
          local_6c._0_4_ = LocalWith;
          goto LAB_0080cf32;
        }
        Js::ByteCodeWriter::BrEnvProperty
                  (pBVar13,BrOnHasEnvProperty,local_6c._4_4_,uVar8,local_44 + 1);
        local_6c._0_4_ = EnvWith;
LAB_0080cef5:
        rec.kind = PVar7 + Local;
      }
      else {
        if (local_44 != -1) {
          Js::ByteCodeWriter::BrEnvProperty
                    (pBVar13,BrOnHasLocalEnvProperty,local_6c._4_4_,uVar8,local_44 + 1);
          local_6c._0_4_ = Env;
          goto LAB_0080cef5;
        }
        Js::ByteCodeWriter::BrLocalProperty(pBVar13,BrOnHasLocalProperty,local_6c._4_4_,uVar8);
        local_6c._0_4_ = Local;
LAB_0080cf32:
        rec.kind = rec.label;
      }
      JsUtil::
      List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_b0,0);
      *(DynamicLoadKind *)
       ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
              ._vptr_ReadOnlyList +
       (long)(int)recList.
                  super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                  buffer * 0xc + 8) = rec.kind;
      *(ulong *)((long)recList.
                       super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                       ._vptr_ReadOnlyList +
                (long)(int)recList.
                           super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                           .buffer * 0xc) = CONCAT44(local_6c._4_4_,local_6c._0_4_);
      recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
      _0_4_ = (int)recList.
                   super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                   buffer + 1;
    } while (!isFncDeclVar);
  }
  if (((pBStack_40 != (ByteCodeGenerator *)0x0 && !skipUseBeforeDeclarationCheck) &&
      (((ulong)pBStack_40->parentScopeInfo & 0x10000) != 0)) && (scope->func == funcInfo)) {
    Js::ByteCodeWriter::W1(&this->m_writer,RuntimeReferenceError,0x13f9);
  }
  if (pBStack_40 == (ByteCodeGenerator *)0x0) {
LAB_0080d0a2:
    PVar7 = *(PropertyId *)(recList._40_8_ + 0x1c);
LAB_0080d0a9:
    uVar1 = this->flags;
    bVar3 = (bool)((isLetDecl | local_31) & (byte)(uVar1 >> 0x16) & 1);
    if ((uVar1 >> 10 & 1) == 0) {
      if ((uVar1 & 4) == 0) {
        OVar6 = GetStFldOpCode(funcInfo,true,isLetDecl,local_31,false,
                               this->forceStrictModeForClassComputedPropertyName);
        uVar8 = FuncInfo::FindOrAddRootObjectInlineCacheId(funcInfo,PVar7,false,true);
        Js::ByteCodeWriter::PatchableRootProperty
                  (&this->m_writer,OVar6,local_38,uVar8,false,true,true);
      }
      else {
        RVar9 = FuncInfo::GetEnvRegister(funcInfo);
        uVar8 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar9,PVar7,false,true);
        OVar6 = GetScopedStFldOpCode(funcInfo,bVar3);
        Js::ByteCodeWriter::ElementP(&this->m_writer,OVar6,local_38,uVar8,false,true);
      }
    }
    else if ((((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) ||
            (bVar5 = FuncInfo::IsGlobalFunction(funcInfo), !bVar5)) {
      RVar9 = FuncInfo::GetEnvRegister(funcInfo);
      uVar8 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar9,PVar7,false,true);
      OVar6 = GetScopedStFldOpCode(funcInfo,bVar3);
      Js::ByteCodeWriter::ElementP(&this->m_writer,OVar6,local_38,uVar8,false,true);
    }
    else {
      uVar8 = FuncInfo::FindOrAddInlineCacheId
                        (funcInfo,funcInfo->frameDisplayRegister,PVar7,false,true);
      OVar6 = GetScopedStFldOpCode(funcInfo,bVar3);
      Js::ByteCodeWriter::ElementP(&this->m_writer,OVar6,local_38,uVar8,false,true);
    }
  }
  else {
    if (((ulong)pBStack_40->parentScopeInfo & 0x80000) != 0) {
      if (pBStack_40 == (ByteCodeGenerator *)0x0) goto LAB_0080d0a2;
      PVar7 = Symbol::EnsurePosition((Symbol *)pBStack_40,this);
      goto LAB_0080d0a9;
    }
    if (((ulong)pBStack_40->parentScopeInfo & 0x200000) == 0) {
      bVar3 = Symbol::IsInSlot((Symbol *)pBStack_40,this,funcInfo,false);
      if (bVar3 || local_44 != -1) {
        if ((local_31 == false) && (((ulong)pBStack_40->parentScopeInfo & 0x40000) != 0)) {
          Js::ByteCodeWriter::W1(&this->m_writer,RuntimeTypeError,0x41f);
        }
        this_00 = pBStack_40;
        RVar9 = Symbol::EnsureScopeSlot((Symbol *)pBStack_40,this,funcInfo);
        bVar4 = isLetDecl | local_31;
        if (bVar4 == 0) {
          bVar3 = NeedCheckBlockVar(this_00,(Symbol *)pBStack_40,scope,funcInfo);
        }
        else {
          bVar3 = false;
        }
        OVar6 = GetStSlotOp(this_00,scope,local_44,rec.label,bVar3,funcInfo);
        if (local_44 == -1) {
          if ((rec.label == -1) ||
             ((rec.label != funcInfo->frameSlotsRegister &&
              (rec.label != funcInfo->frameObjRegister)))) {
            if (scope->innerScopeIndex == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar11 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x12da,"(scope->HasInnerScopeIndex())",
                                 "scope->HasInnerScopeIndex()");
              if (!bVar3) {
LAB_0080d703:
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar11 = 0;
            }
            slotId1 = scope->innerScopeIndex;
            goto LAB_0080d3aa;
          }
          Js::ByteCodeWriter::SlotI1
                    (&this->m_writer,OVar6,local_38,
                     (~*(uint *)((long)&pBStack_40->currentBlock->pnodeNext + 4) & 2) + RVar9);
        }
        else {
          slotId1 = local_44 + 1;
LAB_0080d3aa:
          Js::ByteCodeWriter::SlotI2
                    (&this->m_writer,OVar6,local_38,slotId1,
                     (~*(uint *)((long)&pBStack_40->currentBlock->pnodeNext + 4) & 2) + RVar9);
        }
        bVar3 = ShouldTrackDebuggerMetadata(this);
        if ((bVar4 & bVar3) == 1) {
          if ((scope->field_0x44 & 2) != 0) {
            RVar9 = *(RegSlot *)((long)&pBStack_40->currentTopStatement + 4);
          }
          UpdateDebuggerPropertyInitializationOffset
                    (this,RVar9,*(PropertyId *)&pBStack_40->currentTopStatement,false);
        }
      }
      else {
        if (((local_31 == false) &&
            (pBStack_40->funcInfoStack !=
             (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0)) &&
           (*(OpCode *)
             &(pBStack_40->funcInfoStack->
              super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
              super_SListNodeBase<Memory::ArenaAllocator>.next == knopConstDecl)) {
          Js::ByteCodeWriter::W1(&this->m_writer,RuntimeTypeError,0x41f);
        }
        RVar9 = *(RegSlot *)((long)&pBStack_40->currentTopStatement + 4);
        if (RVar9 != local_38) {
          Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,RVar9,local_38);
          bVar3 = ShouldTrackDebuggerMetadata(this);
          if (((isLetDecl | local_31) & bVar3) == 1) {
            UpdateDebuggerPropertyInitializationOffset
                      (this,*(RegSlot *)((long)&pBStack_40->currentTopStatement + 4),
                       *(PropertyId *)&pBStack_40->currentTopStatement,true);
          }
        }
      }
    }
    else if (((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) {
      Js::ByteCodeWriter::W1(&this->m_writer,RuntimeTypeError,0x13b5);
    }
  }
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer != 0) {
    pBVar13 = &this->m_writer;
    labelID = Js::ByteCodeWriter::DefineLabel(pBVar13);
    Js::ByteCodeWriter::Br(pBVar13,labelID);
    index = 0;
    rec._4_8_ = __tls_get_addr(&PTR_0155fe48);
    do {
      if (pBStack_40 == (ByteCodeGenerator *)0x0) {
        PVar7 = *(PropertyId *)(recList._40_8_ + 0x1c);
      }
      else {
        PVar7 = Symbol::EnsurePosition((Symbol *)pBStack_40,this);
      }
      pTVar12 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b0,index);
      Js::ByteCodeWriter::MarkLabel(pBVar13,pTVar12->label);
      pTVar12 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b0,index);
      switch(pTVar12->kind) {
      case Local:
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,index);
        uVar8 = FuncInfo::FindOrAddInlineCacheId
                          (funcInfo,(pTVar12->field_2).instance,PVar7,false,true);
        Js::ByteCodeWriter::ElementP(pBVar13,StLocalFld,local_38,uVar8,false,true);
        goto LAB_0080d678;
      case Env:
        RVar9 = FuncInfo::AcquireTmpRegister(funcInfo);
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,index);
        Js::ByteCodeWriter::SlotI1(pBVar13,LdEnvObj,RVar9,(pTVar12->field_2).index);
        uVar8 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar9,PVar7,false,true);
        Js::ByteCodeWriter::PatchableProperty(pBVar13,StFld,local_38,RVar9,uVar8,false,true);
        break;
      case LocalWith:
        RVar9 = FuncInfo::AcquireTmpRegister(funcInfo);
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,index);
        Js::ByteCodeWriter::Reg2(pBVar13,UnwrapWithObj,RVar9,(pTVar12->field_2).instance);
        uVar8 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar9,PVar7,false,true);
        Js::ByteCodeWriter::PatchableProperty(pBVar13,StFld,local_38,RVar9,uVar8,false,true);
        break;
      case EnvWith:
        RVar9 = FuncInfo::AcquireTmpRegister(funcInfo);
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,index);
        Js::ByteCodeWriter::SlotI1(pBVar13,LdEnvObj,RVar9,(pTVar12->field_2).index);
        Js::ByteCodeWriter::Reg2(pBVar13,UnwrapWithObj,RVar9,RVar9);
        uVar8 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar9,PVar7,false,true);
        Js::ByteCodeWriter::PatchableProperty(pBVar13,StFld,local_38,RVar9,uVar8,false,true);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)rec._4_8_ = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1326,"((0))","(0)");
        if (bVar3) {
          *(undefined4 *)rec._4_8_ = 0;
          goto LAB_0080d678;
        }
        goto LAB_0080d703;
      }
      FuncInfo::ReleaseTmpRegister(funcInfo,RVar9);
LAB_0080d678:
      if (index == (int)recList.
                        super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                        .buffer + -1) goto LAB_0080d698;
      Js::ByteCodeWriter::Br(pBVar13,labelID);
      index = index + 1;
    } while( true );
  }
LAB_0080d6a3:
  local_b0 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
  if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList != (_func_int **)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
               recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_
               ,recList.
                super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                _vptr_ReadOnlyList,
               (long)(int)recList.
                          super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                          .alloc * 0xc);
  }
  return;
LAB_0080d698:
  Js::ByteCodeWriter::MarkLabel(pBVar13,labelID);
  goto LAB_0080d6a3;
}

Assistant:

void ByteCodeGenerator::EmitPropStore(Js::RegSlot rhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo, bool isLetDecl, bool isConstDecl, bool isFncDeclVar, bool skipUseBeforeDeclarationCheck)
{
    Js::PropertyId envIndex = -1;
    Scope *symScope = sym == nullptr || sym->GetIsGlobal() ? this->globalScope : sym->GetScope();
    Assert(symScope);
    // isFncDeclVar denotes that the symbol being stored to here is the var
    // binding of a function declaration and we know we want to store directly
    // to it, skipping over any dynamic scopes that may lie in between.
    Scope *scope = nullptr;
    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::OpCode op;

    if (sym && sym->GetIsModuleExportStorage())
    {
        if (!isConstDecl && sym->GetDecl() && sym->GetDecl()->nop == knopConstDecl)
        {
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }

        EmitModuleExportAccess(sym, Js::OpCode::StModuleSlot, rhsLocation, funcInfo);
        return;
    }

    if (isFncDeclVar)
    {
        // async functions allow for the fncDeclVar to be in the body or parameter scope
        // of the parent function, so we need to calculate envIndex in lieu of the while
        // loop below.
        do
        {
            scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        } while (scope != symScope);
        Assert(scope == symScope);
        scopeLocation = scope->GetLocation();
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    while (!isFncDeclVar)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }
        if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (!skipUseBeforeDeclarationCheck && sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo)
    {
        EmitUseBeforeDeclarationRuntimeError(this, Js::Constants::NoRegister);
        // Intentionally continue on to do normal EmitPropStore behavior so
        // that the bytecode ends up well-formed for the backend.  This is
        // in contrast to EmitPropLoad and EmitPropTypeof where they both
        // tell EmitUseBeforeDeclarationRuntimeError to emit a LdUndef in place
        // of their load and then they skip emitting their own bytecode.
        // Potayto potahto.
    }

    if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        bool isConsoleScopeLetConst = this->IsConsoleScopeEval() && (isLetDecl || isConstDecl);
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->frameDisplayRegister, propertyId, false, true);
                this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
            }
            else
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, true);
                // In "eval", store to a symbol with unknown scope goes through the closure environment.
                this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, true);

            // In HTML event handler, store to a symbol with unknown scope goes through the closure environment.
            this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
        }
        else
        {
            this->EmitPatchableRootProperty(GetStFldOpCode(funcInfo, true, isLetDecl, isConstDecl, false, forceStrictModeForClassComputedPropertyName), rhsLocation, propertyId, false, true, funcInfo);
        }
    }
    else if (sym->GetIsFuncExpr())
    {
        // Store to function expr variable.

        // strict mode: we need to throw type error
        if (funcInfo->byteCodeFunction->GetIsStrictMode())
        {
            // Note that in this case the sym's location belongs to the parent function, so we can't use it.
            // It doesn't matter which register we use, as long as it's valid for this function.
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_CantAssignToReadOnly));
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        if (!isConstDecl && sym->GetIsConst())
        {
            // This is a case where const reassignment can't be proven statically (e.g., eval, with) so
            // we have to catch it at runtime.
            this->m_writer.W1(
                Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        bool chkBlockVar = !isLetDecl && !isConstDecl && NeedCheckBlockVar(sym, scope, funcInfo);

        // The property is in memory rather than register. We'll have to load it from the slots.
        op = this->GetStSlotOp(scope, envIndex, scopeLocation, chkBlockVar, funcInfo);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, rhsLocation,
                envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var),
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, rhsLocation,
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }
        else
        {
            Assert(scope->HasInnerScopeIndex());
            this->m_writer.SlotI2(op, rhsLocation, scope->GetInnerScopeIndex(),
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }

        if (this->ShouldTrackDebuggerMetadata() && (isLetDecl || isConstDecl))
        {
            Js::PropertyId location = scope->GetIsObject() ? sym->GetLocation() : slot;
            this->UpdateDebuggerPropertyInitializationOffset(location, sym->GetPosition(), false);
        }
    }
    else
    {
        if (!isConstDecl && sym->GetDecl() && sym->GetDecl()->nop == knopConstDecl)
        {
            // This is a case where const reassignment can't be proven statically (e.g., eval, with) so
            // we have to catch it at runtime.
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }
        if (rhsLocation != sym->GetLocation())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, sym->GetLocation(), rhsLocation);

            if (this->ShouldTrackDebuggerMetadata() && (isLetDecl || isConstDecl))
            {
                this->UpdateDebuggerPropertyInitializationOffset(sym->GetLocation(), sym->GetPosition());
            }
        }
    }

    
    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            uint cacheId;
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    cacheId = funcInfo->FindOrAddInlineCacheId(recList.Item(i).instance, propertyId, false, true);
                    this->m_writer.ElementP(Js::OpCode::StLocalFld, rhsLocation, cacheId);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }
        this->m_writer.MarkLabel(doneLabel);
    }
}